

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::GetRegisteredGenerators
          (cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  const_iterator this_00;
  bool bVar1;
  reference ppcVar2;
  pointer __x;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
  local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
  local_38;
  const_iterator i_1;
  __normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
  local_28;
  __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
  local_20;
  const_iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  cmake *this_local;
  
  i._M_current = (cmGlobalGeneratorFactory **)names;
  local_28._M_current =
       (cmGlobalGeneratorFactory **)
       std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::begin
                 (&this->Generators);
  __gnu_cxx::
  __normal_iterator<cmGlobalGeneratorFactory*const*,std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>>
  ::__normal_iterator<cmGlobalGeneratorFactory**>
            ((__normal_iterator<cmGlobalGeneratorFactory*const*,std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>>
              *)&local_20,&local_28);
  while( true ) {
    i_1._M_node = (_Base_ptr)
                  std::
                  vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::
                  end(&this->Generators);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
                        *)&i_1);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
              ::operator*(&local_20);
    (*(*ppcVar2)->_vptr_cmGlobalGeneratorFactory[4])(*ppcVar2,i._M_current);
    __gnu_cxx::
    __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
    ::operator++(&local_20);
  }
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
       ::begin(&this->ExtraGenerators);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
  ::_Rb_tree_const_iterator(&local_38,&local_40);
  while( true ) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
         ::end(&this->ExtraGenerators);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
    ::_Rb_tree_const_iterator(&local_48,&local_50);
    bVar1 = std::operator!=(&local_38,&local_48);
    this_00 = i;
    if (!bVar1) break;
    __x = std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
          ::operator->(&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00._M_current,&__x->first);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void cmake::GetRegisteredGenerators(std::vector<std::string>& names)
{
  for(RegisteredGeneratorsVector::const_iterator i = this->Generators.begin();
      i != this->Generators.end(); ++i)
    {
    (*i)->GetGenerators(names);
    }
  for(RegisteredExtraGeneratorsMap::const_iterator
      i = this->ExtraGenerators.begin();
      i != this->ExtraGenerators.end(); ++i)
    {
    names.push_back(i->first);
    }
}